

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void expand_2s_vec(TCGContext_conflict9 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,
                  uint32_t oprsz,uint32_t tysz,TCGType_conflict type,TCGv_vec c,_Bool scalar_first,
                  _func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_TCGv_vec_conflict9 *fni)

{
  TCGv_vec r;
  TCGv_vec r_00;
  TCGv_vec pTVar1;
  TCGv_vec pTVar2;
  uint uVar3;
  
  r = tcg_temp_new_vec_tricore(tcg_ctx,type);
  r_00 = tcg_temp_new_vec_tricore(tcg_ctx,type);
  for (uVar3 = 0; uVar3 < oprsz; uVar3 = uVar3 + tysz) {
    tcg_gen_ld_vec_tricore(tcg_ctx,r,tcg_ctx->cpu_env,(ulong)(aofs + uVar3));
    pTVar1 = r;
    pTVar2 = c;
    if (scalar_first) {
      pTVar1 = c;
      pTVar2 = r;
    }
    (*fni)(tcg_ctx,vece,r_00,pTVar1,pTVar2);
    tcg_gen_st_vec_tricore(tcg_ctx,r_00,tcg_ctx->cpu_env,(ulong)(dofs + uVar3));
  }
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(r + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(r_00 + (long)tcg_ctx));
  return;
}

Assistant:

static void expand_2s_vec(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                          uint32_t oprsz, uint32_t tysz, TCGType type,
                          TCGv_vec c, bool scalar_first,
                          void (*fni)(TCGContext *, unsigned, TCGv_vec, TCGv_vec, TCGv_vec))
{
    TCGv_vec t0 = tcg_temp_new_vec(tcg_ctx, type);
    TCGv_vec t1 = tcg_temp_new_vec(tcg_ctx, type);
    uint32_t i;

    for (i = 0; i < oprsz; i += tysz) {
        tcg_gen_ld_vec(tcg_ctx, t0, tcg_ctx->cpu_env, aofs + i);
        if (scalar_first) {
            fni(tcg_ctx, vece, t1, c, t0);
        } else {
            fni(tcg_ctx, vece, t1, t0, c);
        }
        tcg_gen_st_vec(tcg_ctx, t1, tcg_ctx->cpu_env, dofs + i);
    }
    tcg_temp_free_vec(tcg_ctx, t0);
    tcg_temp_free_vec(tcg_ctx, t1);
}